

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SetArrayItemC_CI4<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  code *pcVar1;
  bool bVar2;
  uint index_00;
  TypeId TVar3;
  Var pvVar4;
  JavascriptArray *this_00;
  ScriptContext *pSVar5;
  ScriptContext *pSVar6;
  undefined4 *puVar7;
  TypeId typeId;
  Var value;
  uint32 index;
  JavascriptArray *array;
  OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pvVar4 = GetReg<unsigned_short>(this,playout->Instance);
  this_00 = Js::JavascriptArray::FromAnyArray(pvVar4);
  index_00 = (uint)playout->Element;
  pvVar4 = GetReg<unsigned_short>(this,playout->Value);
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pvVar4);
  pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this_00);
  pSVar6 = GetScriptContext(this);
  if (pSVar5 != pSVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x15bf,"(array->GetScriptContext() == GetScriptContext())",
                                "array->GetScriptContext() == GetScriptContext()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  TVar3 = RecyclableObject::GetTypeId((RecyclableObject *)this_00);
  if (TVar3 == TypeIds_NativeIntArray) {
    pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this_00);
    Js::JavascriptArray::OP_SetNativeIntElementC
              ((JavascriptNativeIntArray *)this_00,index_00,pvVar4,pSVar5);
  }
  else if (TVar3 == TypeIds_ArrayLast) {
    pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this_00);
    Js::JavascriptArray::OP_SetNativeFloatElementC
              ((JavascriptNativeFloatArray *)this_00,index_00,pvVar4,pSVar5);
  }
  else {
    Js::JavascriptArray::SetArrayLiteralItem<void*>(this_00,index_00,pvVar4);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetArrayItemC_CI4(const unaligned T* playout)
    {
        JavascriptArray* array = JavascriptArray::FromAnyArray(GetReg(playout->Instance));
        uint32 index = playout->Element;
        Var value = GetReg(playout->Value);

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(value);
#endif

        // The array is create by the built-in on the same script context
        Assert(array->GetScriptContext() == GetScriptContext());
        TypeId typeId = array->GetTypeId();
        if (typeId == TypeIds_NativeIntArray)
        {
            JavascriptArray::OP_SetNativeIntElementC(reinterpret_cast<JavascriptNativeIntArray*>(array), index, value, array->GetScriptContext());
        }
        else if (typeId == TypeIds_NativeFloatArray)
        {
            JavascriptArray::OP_SetNativeFloatElementC(reinterpret_cast<JavascriptNativeFloatArray*>(array), index, value, array->GetScriptContext());
        }
        else
        {
            array->SetArrayLiteralItem(index, value);
        }
    }